

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 03.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  char local_30 [8];
  char pinkish [12];
  char acStack_18 [3];
  char x;
  char h;
  char k;
  char s;
  char n;
  char eme [8];
  
  eme[4] = '\0';
  eme[5] = '\0';
  eme[6] = '\0';
  eme[7] = '\0';
  setlocale(6,"");
  _acStack_18 = 0x6d36333b315b1b;
  std::operator<<((ostream *)&std::cout,acStack_18);
  builtin_strncpy(local_30,"\x1b[38;5;2",8);
  builtin_strncpy(pinkish,"12m",4);
  std::operator<<((ostream *)&std::cout,local_30);
  poVar1 = std::operator<<((ostream *)&std::cout,"Para cada alternativa digite: ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"(n) para o rebelde Nietzsche.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"(s) para o realista shopenhauer.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"(k) para o moralista Kant.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"(h) para o institucionalista Hegel.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator>>((istream *)&std::cin,pinkish + 0xb);
  switch(pinkish[0xb]) {
  case 'h':
    poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_772);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    break;
  default:
    std::operator<<((ostream *)&std::cout,anon_var_dwarf_77c);
    poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_792);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    break;
  case 'k':
    poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_75c);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    break;
  case 'n':
    std::operator<<((ostream *)&std::cout,anon_var_dwarf_71a);
    poVar1 = std::operator<<((ostream *)&std::cout,"Uma ponte sob o abismo!!!");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    break;
  case 's':
    poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_746);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  return 0;
}

Assistant:

int main()
{
  setlocale(LC_ALL, "");
  char eme[] = {0x1b, '[', '1', ';', '3', '6', 'm', 0};
  cout << eme;

  const char n = 'n';
  const char s = 's';
  const char k = 'k';
  const char h = 'h';
  char x;
  char pinkish[] = { 0x1b, '[', '3', '8',';','5',';','2','1','2','m',0 };
  cout << pinkish;

  cout << "Para cada alternativa digite: " << endl;
  cout << "(n) para o rebelde Nietzsche." << endl;
  cout << "(s) para o realista shopenhauer." << endl;
  cout << "(k) para o moralista Kant." << endl;
  cout << "(h) para o institucionalista Hegel." << endl;
  cin >> x;

  switch (x)
  {
  case (n):
    cout << "O Homem é uma ponte atada entre o animal e o super homem!";
    cout << "Uma ponte sob o abismo!!!" << endl;
    break;

  case (s):
    cout << "A solidão é a sorte de todos os espíritos excepcionais!!" << endl;
    break;

  case (k):
    cout << "Belo, é tudo quanto agrada desinteressadamente!!" << endl;
    break;

  case (h):
    cout << "Nada de grande se realizou no mundo sem paixão!!" << endl;
    break;

  default:
    cout << "Sua opção com certeza foi uma grande figura.";
    cout << "Mas não está cadastrada no sistema. Arriverdeci!" << endl;
    break;
  }
  return 0;
}